

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O3

void __thiscall
SparseArray_PairInitialization_Test<unsigned_short>::~SparseArray_PairInitialization_Test
          (SparseArray_PairInitialization_Test<unsigned_short> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST (SparseArray, PairInitialization) {
    std::vector<std::pair<std::size_t, char const *>> const src{
        {0, "zero"}, {2, "two"}, {4, "four"}};
    auto arrp =
        sparse_array<std::string, TypeParam>::make_unique (std::begin (src), std::end (src));
    auto & arr = *arrp;

    EXPECT_EQ (arr[0], "zero");
    EXPECT_FALSE (arr.has_index (1));
    EXPECT_EQ (arr[2], "two");
    EXPECT_FALSE (arr.has_index (3));
    EXPECT_EQ (arr[4], "four");
}